

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.cpp
# Opt level: O2

Rect __thiscall nite::Rect::operator+(Rect *this,float c)

{
  float fVar1;
  float fVar2;
  float *in_RSI;
  undefined4 in_XMM0_Db;
  Rect RVar3;
  
  RVar3.w = *in_RSI + c;
  fVar1 = in_RSI[1];
  fVar2 = in_RSI[2];
  RVar3.x = c + in_RSI[3];
  RVar3.y = (float)in_XMM0_Db;
  this->x = RVar3.w;
  this->y = fVar1 + c;
  this->w = fVar2 + c;
  this->h = RVar3.x;
  RVar3.h = 0.0;
  return RVar3;
}

Assistant:

nite::Rect nite::Rect::operator+(float c){
	Rect R = *this;
	R.x += c;
	R.y += c;
	R.w += c;
	R.h += c;
	return R;
}